

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgConvexHull3d.cpp
# Opt level: O2

void __thiscall
dgConvexHull3d::TessellateTriangle
          (dgConvexHull3d *this,HaI32 level,dgVector *p0,dgVector *p1,dgVector *p2,HaI32 *count,
          dgBigVector *ouput,HaI32 *start)

{
  dgBigVector *pdVar1;
  float fVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  dgVector dVar11;
  int level_00;
  undefined1 auVar12 [16];
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar18 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar29 [56];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  dgTemplateVector<float> dVar34;
  dgVector p20;
  dgVector p12;
  double local_b8;
  dgTemplateVector<float> local_88;
  dgVector p01;
  double dStack_68;
  dgBigVector local_50;
  
  if (level == 0) {
    dgBigVector::dgBigVector((dgBigVector *)&p12,p0);
    dgBigVector::dgBigVector((dgBigVector *)&p20,p1);
    dgBigVector::dgBigVector(&local_50,p2);
    dgBigPlane::dgBigPlane((dgBigPlane *)&p01,(dgBigVector *)&p12,(dgBigVector *)&p20,&local_50);
    auVar12._8_8_ = 0;
    auVar12._0_4_ = p01.super_dgTemplateVector<float>.m_x;
    auVar12._4_4_ = p01.super_dgTemplateVector<float>.m_y;
    auVar25._8_8_ = 0;
    auVar25._0_8_ =
         (double)p01.super_dgTemplateVector<float>._8_8_ *
         (double)p01.super_dgTemplateVector<float>._8_8_;
    auVar12 = vfmadd231sd_fma(auVar25,auVar12,auVar12);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dStack_68;
    auVar12 = vfmadd213sd_fma(auVar14,auVar14,auVar12);
    auVar12 = vsqrtsd_avx(auVar12,auVar12);
    dgBigPlane::Scale((dgBigPlane *)&p12,(dgBigPlane *)&p01,(HaF64)(1.0 / auVar12._0_8_));
    pdVar1 = ouput + *start;
    (pdVar1->super_dgTemplateVector<double>).m_x = (double)p12.super_dgTemplateVector<float>._0_8_;
    (pdVar1->super_dgTemplateVector<double>).m_y = (double)p12.super_dgTemplateVector<float>._8_8_;
    (pdVar1->super_dgTemplateVector<double>).m_z = local_b8;
    (pdVar1->super_dgTemplateVector<double>).m_w = 0.0;
    *start = *start + 8;
    *count = *count + 1;
  }
  else {
    fVar13 = dgTemplateVector<float>::operator%
                       (&p0->super_dgTemplateVector<float>,&p0->super_dgTemplateVector<float>);
    fVar13 = fVar13 + -1.0;
    auVar5._8_4_ = 0x80000000;
    auVar5._0_8_ = 0x8000000080000000;
    auVar5._12_4_ = 0x80000000;
    auVar12 = vxorps_avx512vl(ZEXT416((uint)fVar13),auVar5);
    uVar3 = vcmpss_avx512f(auVar12,ZEXT416((uint)fVar13),2);
    bVar4 = (bool)((byte)uVar3 & 1);
    if (0.0001 <= (float)((uint)bVar4 * (int)fVar13 + (uint)!bVar4 * auVar12._0_4_)) {
      __assert_fail("dgAbsf (p0 % p0 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                    ,0x1c8,
                    "void dgConvexHull3d::TessellateTriangle(hacd::HaI32, const dgVector &, const dgVector &, const dgVector &, hacd::HaI32 &, dgBigVector *const, hacd::HaI32 &) const"
                   );
    }
    fVar13 = dgTemplateVector<float>::operator%
                       (&p1->super_dgTemplateVector<float>,&p1->super_dgTemplateVector<float>);
    fVar13 = fVar13 + -1.0;
    auVar6._8_4_ = 0x80000000;
    auVar6._0_8_ = 0x8000000080000000;
    auVar6._12_4_ = 0x80000000;
    auVar12 = vxorps_avx512vl(ZEXT416((uint)fVar13),auVar6);
    uVar3 = vcmpss_avx512f(auVar12,ZEXT416((uint)fVar13),2);
    bVar4 = (bool)((byte)uVar3 & 1);
    if (0.0001 <= (float)((uint)bVar4 * (int)fVar13 + (uint)!bVar4 * auVar12._0_4_)) {
      __assert_fail("dgAbsf (p1 % p1 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                    ,0x1c9,
                    "void dgConvexHull3d::TessellateTriangle(hacd::HaI32, const dgVector &, const dgVector &, const dgVector &, hacd::HaI32 &, dgBigVector *const, hacd::HaI32 &) const"
                   );
    }
    fVar13 = dgTemplateVector<float>::operator%
                       (&p2->super_dgTemplateVector<float>,&p2->super_dgTemplateVector<float>);
    fVar13 = fVar13 + -1.0;
    auVar18 = (undefined1  [56])0x0;
    auVar7._8_4_ = 0x80000000;
    auVar7._0_8_ = 0x8000000080000000;
    auVar7._12_4_ = 0x80000000;
    auVar12 = vxorps_avx512vl(ZEXT416((uint)fVar13),auVar7);
    uVar3 = vcmpss_avx512f(auVar12,ZEXT416((uint)fVar13),2);
    bVar4 = (bool)((byte)uVar3 & 1);
    auVar29 = ZEXT856(auVar12._8_8_);
    if (0.0001 <= (float)((uint)bVar4 * (int)fVar13 + (uint)!bVar4 * auVar12._0_4_)) {
      __assert_fail("dgAbsf (p2 % p2 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                    ,0x1ca,
                    "void dgConvexHull3d::TessellateTriangle(hacd::HaI32, const dgVector &, const dgVector &, const dgVector &, hacd::HaI32 &, dgBigVector *const, hacd::HaI32 &) const"
                   );
    }
    dVar34 = dgTemplateVector<float>::operator+
                       (&p0->super_dgTemplateVector<float>,&p1->super_dgTemplateVector<float>);
    auVar26._0_8_ = dVar34._8_8_;
    auVar26._8_56_ = auVar29;
    auVar15._0_8_ = dVar34._0_8_;
    auVar15._8_56_ = auVar18;
    p12.super_dgTemplateVector<float> =
         (dgTemplateVector<float>)vmovlhps_avx(auVar15._0_16_,auVar26._0_16_);
    auVar18 = ZEXT856(p12.super_dgTemplateVector<float>._8_8_);
    dgVector::dgVector(&p01,&p12.super_dgTemplateVector<float>);
    dVar34 = dgTemplateVector<float>::operator+
                       (&p1->super_dgTemplateVector<float>,&p2->super_dgTemplateVector<float>);
    auVar27._0_8_ = dVar34._8_8_;
    auVar27._8_56_ = auVar29;
    auVar16._0_8_ = dVar34._0_8_;
    auVar16._8_56_ = auVar18;
    p20.super_dgTemplateVector<float> =
         (dgTemplateVector<float>)vmovlhps_avx(auVar16._0_16_,auVar27._0_16_);
    auVar18 = ZEXT856(p20.super_dgTemplateVector<float>._8_8_);
    dgVector::dgVector(&p12,&p20.super_dgTemplateVector<float>);
    dVar34 = dgTemplateVector<float>::operator+
                       (&p2->super_dgTemplateVector<float>,&p0->super_dgTemplateVector<float>);
    auVar28._0_8_ = dVar34._8_8_;
    auVar28._8_56_ = auVar29;
    auVar17._0_8_ = dVar34._0_8_;
    auVar17._8_56_ = auVar18;
    local_50.super_dgTemplateVector<double>._0_16_ = vmovlhps_avx(auVar17._0_16_,auVar28._0_16_);
    dgVector::dgVector(&p20,(dgTemplateVector<float> *)&local_50);
    auVar19._8_8_ = 0;
    auVar19._0_4_ = p01.super_dgTemplateVector<float>.m_x;
    auVar19._4_4_ = p01.super_dgTemplateVector<float>.m_y;
    fVar13 = p01.super_dgTemplateVector<float>.m_x;
    auVar31._0_4_ = fVar13 * fVar13;
    fVar2 = p01.super_dgTemplateVector<float>.m_y;
    auVar31._4_4_ = fVar2 * fVar2;
    auVar31._8_8_ = 0;
    auVar12 = vmovshdup_avx(auVar31);
    auVar12 = vfmadd231ss_fma(auVar12,auVar19,auVar19);
    auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)p01.super_dgTemplateVector<float>.m_z),
                              ZEXT416((uint)p01.super_dgTemplateVector<float>.m_z));
    auVar12 = vsqrtss_avx(auVar12,auVar12);
    fVar30 = 1.0 / auVar12._0_4_;
    auVar12 = vinsertps_avx(ZEXT416((uint)(p01.super_dgTemplateVector<float>.m_z * fVar30)),
                            ZEXT416((uint)p01.super_dgTemplateVector<float>.m_w),0x10);
    auVar20._0_4_ = fVar13 * fVar30;
    auVar20._4_4_ = fVar2 * fVar30;
    auVar20._8_4_ = fVar30 * 0.0;
    auVar20._12_4_ = fVar30 * 0.0;
    local_88 = (dgTemplateVector<float>)vmovlhps_avx(auVar20,auVar12);
    dgVector::dgVector((dgVector *)&local_50,&local_88);
    dVar11 = p12;
    auVar21._8_8_ = 0;
    auVar21._0_4_ = p12.super_dgTemplateVector<float>.m_x;
    auVar21._4_4_ = p12.super_dgTemplateVector<float>.m_y;
    fVar13 = dVar11.super_dgTemplateVector<float>.m_x;
    auVar32._0_4_ = fVar13 * fVar13;
    fVar2 = dVar11.super_dgTemplateVector<float>.m_y;
    auVar32._4_4_ = fVar2 * fVar2;
    auVar32._8_8_ = 0;
    p01.super_dgTemplateVector<float>._0_8_ = local_50.super_dgTemplateVector<double>.m_x;
    p01.super_dgTemplateVector<float>._8_8_ = local_50.super_dgTemplateVector<double>.m_y;
    p12.super_dgTemplateVector<float>.m_z = dVar11.super_dgTemplateVector<float>.m_z;
    auVar12 = vmovshdup_avx(auVar32);
    auVar12 = vfmadd231ss_fma(auVar12,auVar21,auVar21);
    auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)p12.super_dgTemplateVector<float>.m_z),
                              ZEXT416((uint)p12.super_dgTemplateVector<float>.m_z));
    auVar12 = vsqrtss_avx(auVar12,auVar12);
    fVar30 = 1.0 / auVar12._0_4_;
    p12.super_dgTemplateVector<float>.m_w = dVar11.super_dgTemplateVector<float>.m_w;
    auVar12 = vinsertps_avx(ZEXT416((uint)(p12.super_dgTemplateVector<float>.m_z * fVar30)),
                            ZEXT416((uint)p12.super_dgTemplateVector<float>.m_w),0x10);
    auVar22._0_4_ = fVar13 * fVar30;
    auVar22._4_4_ = fVar2 * fVar30;
    auVar22._8_4_ = fVar30 * 0.0;
    auVar22._12_4_ = fVar30 * 0.0;
    local_88 = (dgTemplateVector<float>)vmovlhps_avx(auVar22,auVar12);
    p12 = dVar11;
    dgVector::dgVector((dgVector *)&local_50,&local_88);
    dVar11 = p20;
    auVar23._8_8_ = 0;
    auVar23._0_4_ = p20.super_dgTemplateVector<float>.m_x;
    auVar23._4_4_ = p20.super_dgTemplateVector<float>.m_y;
    p12.super_dgTemplateVector<float> =
         (dgTemplateVector<float>)local_50.super_dgTemplateVector<double>._0_16_;
    fVar13 = dVar11.super_dgTemplateVector<float>.m_x;
    auVar33._0_4_ = fVar13 * fVar13;
    fVar2 = dVar11.super_dgTemplateVector<float>.m_y;
    auVar33._4_4_ = fVar2 * fVar2;
    auVar33._8_8_ = 0;
    p20.super_dgTemplateVector<float>.m_z = dVar11.super_dgTemplateVector<float>.m_z;
    auVar12 = vmovshdup_avx(auVar33);
    auVar12 = vfmadd231ss_fma(auVar12,auVar23,auVar23);
    auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)p20.super_dgTemplateVector<float>.m_z),
                              ZEXT416((uint)p20.super_dgTemplateVector<float>.m_z));
    auVar12 = vsqrtss_avx(auVar12,auVar12);
    fVar30 = 1.0 / auVar12._0_4_;
    p20.super_dgTemplateVector<float>.m_w = dVar11.super_dgTemplateVector<float>.m_w;
    auVar12 = vinsertps_avx(ZEXT416((uint)(p20.super_dgTemplateVector<float>.m_z * fVar30)),
                            ZEXT416((uint)p20.super_dgTemplateVector<float>.m_w),0x10);
    auVar24._0_4_ = fVar13 * fVar30;
    auVar24._4_4_ = fVar2 * fVar30;
    auVar24._8_4_ = fVar30 * 0.0;
    auVar24._12_4_ = fVar30 * 0.0;
    local_88 = (dgTemplateVector<float>)vmovlhps_avx(auVar24,auVar12);
    p20 = dVar11;
    dgVector::dgVector((dgVector *)&local_50,&local_88);
    p20.super_dgTemplateVector<float> =
         (dgTemplateVector<float>)local_50.super_dgTemplateVector<double>._0_16_;
    dVar11.super_dgTemplateVector<float> = p20.super_dgTemplateVector<float>;
    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(p01.super_dgTemplateVector<float>.m_y *
                                            p01.super_dgTemplateVector<float>.m_y)),
                              ZEXT416((uint)p01.super_dgTemplateVector<float>.m_x),
                              ZEXT416((uint)p01.super_dgTemplateVector<float>.m_x));
    auVar12 = vfmadd213ss_fma(ZEXT416((uint)p01.super_dgTemplateVector<float>.m_z),
                              ZEXT416((uint)p01.super_dgTemplateVector<float>.m_z),auVar12);
    fVar13 = auVar12._0_4_ + -1.0;
    auVar8._8_4_ = 0x80000000;
    auVar8._0_8_ = 0x8000000080000000;
    auVar8._12_4_ = 0x80000000;
    auVar12 = vxorps_avx512vl(ZEXT416((uint)fVar13),auVar8);
    uVar3 = vcmpss_avx512f(auVar12,ZEXT416((uint)fVar13),2);
    bVar4 = (bool)((byte)uVar3 & 1);
    if (0.0001 <= (float)((uint)bVar4 * (int)fVar13 + (uint)!bVar4 * auVar12._0_4_)) {
      __assert_fail("dgAbsf (p01 % p01 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                    ,0x1d3,
                    "void dgConvexHull3d::TessellateTriangle(hacd::HaI32, const dgVector &, const dgVector &, const dgVector &, hacd::HaI32 &, dgBigVector *const, hacd::HaI32 &) const"
                   );
    }
    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(p12.super_dgTemplateVector<float>.m_y *
                                            p12.super_dgTemplateVector<float>.m_y)),
                              ZEXT416((uint)p12.super_dgTemplateVector<float>.m_x),
                              ZEXT416((uint)p12.super_dgTemplateVector<float>.m_x));
    auVar12 = vfmadd213ss_fma(ZEXT416((uint)p12.super_dgTemplateVector<float>.m_z),
                              ZEXT416((uint)p12.super_dgTemplateVector<float>.m_z),auVar12);
    fVar13 = auVar12._0_4_ + -1.0;
    auVar9._8_4_ = 0x80000000;
    auVar9._0_8_ = 0x8000000080000000;
    auVar9._12_4_ = 0x80000000;
    auVar12 = vxorps_avx512vl(ZEXT416((uint)fVar13),auVar9);
    uVar3 = vcmpss_avx512f(auVar12,ZEXT416((uint)fVar13),2);
    bVar4 = (bool)((byte)uVar3 & 1);
    if (0.0001 <= (float)((uint)bVar4 * (int)fVar13 + (uint)!bVar4 * auVar12._0_4_)) {
      __assert_fail("dgAbsf (p12 % p12 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                    ,0x1d4,
                    "void dgConvexHull3d::TessellateTriangle(hacd::HaI32, const dgVector &, const dgVector &, const dgVector &, hacd::HaI32 &, dgBigVector *const, hacd::HaI32 &) const"
                   );
    }
    p20.super_dgTemplateVector<float>.m_y = local_50.super_dgTemplateVector<double>.m_x._4_4_;
    p20.super_dgTemplateVector<float>.m_x = local_50.super_dgTemplateVector<double>.m_x._0_4_;
    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(p20.super_dgTemplateVector<float>.m_y *
                                            p20.super_dgTemplateVector<float>.m_y)),
                              ZEXT416((uint)p20.super_dgTemplateVector<float>.m_x),
                              ZEXT416((uint)p20.super_dgTemplateVector<float>.m_x));
    p20.super_dgTemplateVector<float>.m_z = local_50.super_dgTemplateVector<double>.m_y._0_4_;
    auVar12 = vfmadd213ss_fma(ZEXT416((uint)p20.super_dgTemplateVector<float>.m_z),
                              ZEXT416((uint)p20.super_dgTemplateVector<float>.m_z),auVar12);
    fVar13 = auVar12._0_4_ + -1.0;
    auVar10._8_4_ = 0x80000000;
    auVar10._0_8_ = 0x8000000080000000;
    auVar10._12_4_ = 0x80000000;
    auVar12 = vxorps_avx512vl(ZEXT416((uint)fVar13),auVar10);
    uVar3 = vcmpss_avx512f(auVar12,ZEXT416((uint)fVar13),2);
    bVar4 = (bool)((byte)uVar3 & 1);
    p20.super_dgTemplateVector<float> = dVar11.super_dgTemplateVector<float>;
    if (0.0001 <= (float)((uint)bVar4 * (int)fVar13 + (uint)!bVar4 * auVar12._0_4_)) {
      __assert_fail("dgAbsf (p20 % p20 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                    ,0x1d5,
                    "void dgConvexHull3d::TessellateTriangle(hacd::HaI32, const dgVector &, const dgVector &, const dgVector &, hacd::HaI32 &, dgBigVector *const, hacd::HaI32 &) const"
                   );
    }
    level_00 = level + -1;
    TessellateTriangle(this,level_00,p0,&p01,&p20,count,ouput,start);
    TessellateTriangle(this,level_00,p1,&p12,&p01,count,ouput,start);
    TessellateTriangle(this,level_00,p2,&p20,&p12,count,ouput,start);
    TessellateTriangle(this,level_00,&p01,&p12,&p20,count,ouput,start);
  }
  return;
}

Assistant:

void dgConvexHull3d::TessellateTriangle (hacd::HaI32 level, const dgVector& p0, const dgVector& p1, const dgVector& p2, hacd::HaI32& count, dgBigVector* const ouput, hacd::HaI32& start) const
{
	if (level) {
		HACD_ASSERT (dgAbsf (p0 % p0 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f));
		HACD_ASSERT (dgAbsf (p1 % p1 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f));
		HACD_ASSERT (dgAbsf (p2 % p2 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f));
		dgVector p01 (p0 + p1);
		dgVector p12 (p1 + p2);
		dgVector p20 (p2 + p0);

		p01 = p01.Scale (hacd::HaF32 (1.0f) / dgSqrt(p01 % p01));
		p12 = p12.Scale (hacd::HaF32 (1.0f) / dgSqrt(p12 % p12));
		p20 = p20.Scale (hacd::HaF32 (1.0f) / dgSqrt(p20 % p20));

		HACD_ASSERT (dgAbsf (p01 % p01 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f));
		HACD_ASSERT (dgAbsf (p12 % p12 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f));
		HACD_ASSERT (dgAbsf (p20 % p20 - hacd::HaF32 (1.0f)) < hacd::HaF32 (1.0e-4f));

		TessellateTriangle  (level - 1, p0,  p01, p20, count, ouput, start);
		TessellateTriangle  (level - 1, p1,  p12, p01, count, ouput, start);
		TessellateTriangle  (level - 1, p2,  p20, p12, count, ouput, start);
		TessellateTriangle  (level - 1, p01, p12, p20, count, ouput, start);

	} else {
		dgBigPlane n (p0, p1, p2);
		n = n.Scale (hacd::HaF64(1.0f) / sqrt (n % n));
		n.m_w = hacd::HaF64(0.0f);
		ouput[start] = n;
		start += 8;
		count ++;
	}
}